

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmfilegen.cpp
# Opt level: O1

void randomize_list(read_list_t *read_list,ui32_t check_total)

{
  undefined4 uVar1;
  undefined8 uVar2;
  ulong uVar3;
  ulong uVar4;
  read_list_t *prVar5;
  read_list_t t;
  
  if (check_total != 0) {
    uVar4 = 0;
    prVar5 = read_list;
    do {
      if (3 < randomize_list::seq) {
        randomize_list::seq = 0;
      }
      if (randomize_list::seq == 0) {
        Kumu::FortunaRNG::FillRandom(&s_RNG,0x10a1f0);
      }
      uVar3 = (ulong)randomize_list::seq;
      randomize_list::seq = randomize_list::seq + 1;
      uVar3 = (ulong)randomize_list::tmp_ints[uVar3] % (ulong)(check_total - 1);
      if (uVar4 != uVar3) {
        uVar1 = *(undefined4 *)((long)&read_list[uVar3].position + 4);
        uVar2 = *(undefined8 *)(read_list + uVar3);
        *(undefined4 *)((long)&read_list[uVar3].position + 4) =
             *(undefined4 *)((long)&prVar5->position + 4);
        *(undefined8 *)(read_list + uVar3) = *(undefined8 *)prVar5;
        *(undefined4 *)((long)&prVar5->position + 4) = uVar1;
        *(undefined8 *)prVar5 = uVar2;
      }
      uVar4 = uVar4 + 1;
      prVar5 = prVar5 + 1;
    } while (check_total != uVar4);
  }
  return;
}

Assistant:

void
randomize_list(read_list_t* read_list, ui32_t check_total)
{
  static ui32_t tmp_ints[4];
  static ui32_t seq = 0;

  for ( ui32_t j = 0; j < check_total; j++ )
    {
      if ( seq > 3 )
	seq = 0;

      if ( seq == 0 )
	s_RNG.FillRandom((byte_t*)tmp_ints, 16);

      ui32_t i = tmp_ints[seq++] % (check_total - 1);

      if ( i == j )
	continue;

      read_list_t t = read_list[i];
      read_list[i] = read_list[j];
      read_list[j] = t;
    }
}